

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

QList<QTextEdit::ExtraSelection> * __thiscall
QWidgetTextControl::extraSelections(QWidgetTextControl *this)

{
  QWidgetTextControlPrivate *this_00;
  qsizetype qVar1;
  const_reference pSVar2;
  ExtraSelection *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  Selection *sel2;
  int i;
  int numExtraSelections;
  QWidgetTextControlPrivate *d;
  QList<QTextEdit::ExtraSelection> *selections;
  ExtraSelection sel;
  parameter_type in_stack_ffffffffffffff98;
  ExtraSelection *this_01;
  int local_44;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QWidgetTextControl *)0x71d867);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->format = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->format).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QTextEdit::ExtraSelection>::QList((QList<QTextEdit::ExtraSelection> *)0x71d89b);
  qVar1 = QList<QAbstractTextDocumentLayout::Selection>::size(&this_00->extraSelections);
  QList<QTextEdit::ExtraSelection>::reserve
            ((QList<QTextEdit::ExtraSelection> *)this_00,in_stack_00000008);
  for (local_44 = 0; local_44 < (int)qVar1; local_44 = local_44 + 1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextEdit::ExtraSelection::ExtraSelection(this_01);
    pSVar2 = QList<QAbstractTextDocumentLayout::Selection>::at
                       ((QList<QAbstractTextDocumentLayout::Selection> *)this_01,
                        (qsizetype)in_stack_ffffffffffffff98);
    QTextCursor::operator=((QTextCursor *)&local_20,&pSVar2->cursor);
    QTextCharFormat::operator=
              ((QTextCharFormat *)this_01,(QTextCharFormat *)in_stack_ffffffffffffff98);
    QList<QTextEdit::ExtraSelection>::append
              ((QList<QTextEdit::ExtraSelection> *)this_01,in_stack_ffffffffffffff98);
    QTextEdit::ExtraSelection::~ExtraSelection(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QTextEdit::ExtraSelection> *)this_01;
}

Assistant:

QList<QTextEdit::ExtraSelection> QWidgetTextControl::extraSelections() const
{
    Q_D(const QWidgetTextControl);
    QList<QTextEdit::ExtraSelection> selections;
    const int numExtraSelections = d->extraSelections.size();
    selections.reserve(numExtraSelections);
    for (int i = 0; i < numExtraSelections; ++i) {
        QTextEdit::ExtraSelection sel;
        const QAbstractTextDocumentLayout::Selection &sel2 = d->extraSelections.at(i);
        sel.cursor = sel2.cursor;
        sel.format = sel2.format;
        selections.append(sel);
    }
    return selections;
}